

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

void interpreter(str *program,str *input,ostream *out,ostream *err)

{
  uint uVar1;
  s_i raw;
  str *psVar2;
  pointer pDVar3;
  bool bVar4;
  encoding_t eVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  pointer pcVar10;
  ostream *this;
  encoding_t eVar11;
  pointer pDVar12;
  bool bVar13;
  undefined8 uStackY_200;
  bool empty;
  encoding_t local_1d4;
  undefined8 local_1d0;
  encoding_t local_1c4;
  ostream *local_1c0;
  undefined8 local_1b8;
  str *local_1b0;
  P_Sequence *local_1a8;
  undefined8 local_1a0;
  ostream *local_198;
  encoding_t local_18c;
  vector<Direction,_std::allocator<Direction>_> dirs;
  undefined7 uStack_15f;
  parse_exc e;
  State local_f8;
  s_i body;
  State local_88;
  
  local_1c0 = err;
  local_1b0 = input;
  local_198 = out;
  eVar5 = detect_encoding(program);
  local_1d0 = 0;
  uVar9 = std::__cxx11::string::find((char)program,10);
  dirs.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  dirs.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  dirs.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  e.super_exception = (exception)0x1;
  e._1_7_ = 0;
  std::vector<Direction,_std::allocator<Direction>_>::emplace_back<point>(&dirs,(point *)&e);
  pcVar10 = (program->_M_dataplus)._M_p;
  local_1c4 = eVar5;
  if (uVar9 == 0xffffffffffffffff) {
    bVar4 = true;
    iVar8 = -0x80000000;
    local_1a0 = 0;
    local_1b8 = 0;
    local_1d4 = ENC_ASCII;
  }
  else {
    e.msg._0_1_ = eVar5 == ENC_UTF8;
    local_1a0 = 0;
    iVar8 = -0x80000000;
    local_1b8 = 0;
    local_1d0 = 0;
    local_1a8 = (P_Sequence *)CONCAT44(local_1a8._4_4_,1);
    local_1d4 = ENC_ASCII;
    e._0_8_ = program;
    e._16_8_ = pcVar10;
    while ((ulong)(e._16_8_ - (long)pcVar10) < uVar9) {
      iVar6 = s_i::get((s_i *)&e);
      uVar1 = iVar6 - 0x3f;
      if (uVar1 < 8) {
        switch(uVar1) {
        case 0:
          uStackY_200 = 1;
LAB_00109767:
          local_1d0 = uStackY_200;
          break;
        default:
          goto switchD_00109763_caseD_1;
        case 2:
          local_1a0 = CONCAT71((int7)((ulong)((long)&switchD_00109763::switchdataD_0010f06c +
                                             (long)(int)(&switchD_00109763::switchdataD_0010f06c)
                                                        [uVar1]) >> 8),1);
          break;
        case 6:
          iVar8 = s_i::get((s_i *)&e);
          break;
        case 7:
          iVar8 = 0x20;
        }
      }
      else if (iVar6 == 0x5e) {
        local_1a8 = (P_Sequence *)((ulong)local_1a8 & 0xffffffff00000000);
      }
      else if (iVar6 == 0x2c) {
        iVar7 = s_i::peek((s_i *)&e,0);
        if (iVar7 == 0x2c) {
          skip_comment((s_i *)&e);
        }
        else {
switchD_00109763_caseD_1:
          bVar4 = is_dir_inst(iVar6,false);
          if (bVar4) {
            s_i::back((s_i *)&e);
            read_dirs((vector<Direction,_std::allocator<Direction>_> *)&local_f8,(s_i *)&e,false);
            std::vector<Direction,_std::allocator<Direction>_>::_M_move_assign(&dirs);
            std::_Vector_base<Direction,_std::allocator<Direction>_>::~_Vector_base
                      ((_Vector_base<Direction,_std::allocator<Direction>_> *)&local_f8);
          }
          else {
            iVar7 = isspace(iVar6);
            if (iVar7 == 0) {
              this = std::operator<<(local_1c0,"Unrecognized option: ");
              std::ostream::operator<<(this,iVar6);
              goto LAB_00109954;
            }
          }
        }
      }
      else if (iVar6 == 0x4d) {
        local_1b8 = CONCAT71((uint7)(uint3)(uVar1 >> 8),1);
      }
      else {
        if (iVar6 != 0x52) {
          if (iVar6 == 0x26) {
            uStackY_200 = 2;
            goto LAB_00109767;
          }
          goto switchD_00109763_caseD_1;
        }
        local_1d4 = ENC_UTF8;
      }
      pcVar10 = *(pointer *)e._0_8_;
    }
    bVar4 = (int)local_1a8 == 1;
    pcVar10 = (program->_M_dataplus)._M_p;
  }
  eVar5 = local_1c4;
  body.utf8 = local_1c4 == ENC_UTF8;
  body.i = pcVar10 + uVar9 + 1;
  body.s = program;
  local_1a8 = parse(&body);
  psVar2 = local_1b0;
  if (eVar5 == ENC_SINGLE_BYTE) {
    bVar13 = false;
  }
  else {
    eVar5 = detect_encoding(local_1b0);
    bVar13 = eVar5 != ENC_SINGLE_BYTE;
  }
  raw._9_7_ = uStack_15f;
  raw.utf8 = bVar13;
  raw.s = psVar2;
  raw.i = (psVar2->_M_dataplus)._M_p;
  Grid::Grid(&local_f8.cg,raw,10,local_1d4,iVar8,&empty);
  State::State((State *)&e,&local_f8.cg,(bool)((byte)local_1b8 & 1));
  Grid::~Grid(&local_f8.cg);
  if (((int)local_1d0 == 2 & empty) == 1) {
    std::ostream::operator<<(local_198,1);
  }
  else {
    eVar5 = ENC_UTF8;
    local_18c = eVar5;
    if (bVar4) {
      eVar5 = Grid::bWidth((Grid *)&e);
      local_18c = Grid::bHeight((Grid *)&e);
    }
    if ((int)eVar5 < 1) {
      eVar5 = ENC_ASCII;
    }
    local_1b0 = (str *)((ulong)local_1b0 & 0xffffffff00000000);
    if ((int)local_18c < 1) {
      local_18c = ENC_ASCII;
    }
    local_1b8 = CONCAT44(local_1b8._4_4_,(uint)(byte)local_1a0) & 0xffffffff00000001;
    eVar11 = ENC_ASCII;
    local_1c4 = eVar5;
    while (eVar11 != local_18c) {
      local_1d4 = eVar11;
      for (eVar5 = ENC_ASCII;
          pDVar3 = dirs.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
                   super__Vector_impl_data._M_finish,
          pDVar12 = dirs.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
                    super__Vector_impl_data._M_start, eVar5 != local_1c4; eVar5 = eVar5 + ENC_UTF8)
      {
        while (pDVar12 != pDVar3) {
          State::State(&local_f8,(State *)&e);
          local_f8.direction.x = pDVar12->x[0];
          local_f8.direction.y = pDVar12->x[1];
          local_f8.position.y = local_1d4;
          local_f8.position.x = eVar5;
          State::State(&local_88,&local_f8);
          iVar8 = match(&local_88,local_1a8,SUB81(local_1b8,0));
          State::~State(&local_88);
          if (iVar8 < 1) {
            if (iVar8 == -1) {
              std::operator<<(local_1c0,"Stack Overflow\n");
              goto LAB_00109a9b;
            }
            bVar4 = true;
            iVar6 = 0;
            if ((int)local_1d0 == 2) goto LAB_00109a7e;
          }
          else {
            iVar6 = 1;
            if ((int)local_1d0 == 1) {
LAB_00109a7e:
              std::ostream::operator<<(local_198,iVar6);
LAB_00109a9b:
              bVar4 = false;
            }
            else {
              local_1b0 = (str *)CONCAT44(local_1b0._4_4_,(int)local_1b0 + iVar8);
              bVar4 = true;
            }
          }
          State::~State(&local_f8);
          pDVar12 = pDVar12 + 1;
          if (!bVar4) goto LAB_00109947;
        }
      }
      eVar11 = local_1d4 + ENC_UTF8;
    }
    iVar8 = (int)local_1b0;
    if ((int)local_1d0 == 2) {
      iVar8 = 1;
    }
    std::ostream::operator<<(local_198,iVar8);
  }
LAB_00109947:
  State::~State((State *)&e);
LAB_00109954:
  std::_Vector_base<Direction,_std::allocator<Direction>_>::~_Vector_base
            (&dirs.super__Vector_base<Direction,_std::allocator<Direction>_>);
  return;
}

Assistant:

void interpreter(const str &program, const str &input, std::ostream &out, std::ostream &err) {
    encoding_t progEnc = detect_encoding(program);
    size_t nl = program.find('\n');
    m_just just = M_JUST_LEFT; m_start start = M_START_ALLBOX; m_type type = M_TYPE_COUNT;
    int chfill = OUT_CHAR;
    bool mobile = false, allpaths = false;
    vector<Direction> dirs;
    dirs.emplace_back( point{ 1, 0 } );

    if (~nl) {
        s_i o{ program, progEnc == ENC_UTF8 };
        for (int c; o.ind() < nl; ) {
            c = o.get();
            if (c == INST_OPTION_TYPE_BOOLEAN) type = M_TYPE_BOOLEAN;
            else if (c == INST_OPTION_TYPE_ALL) type = M_TYPE_ALL;
            else if (c == INST_OPTION_RJUST) just = M_JUST_RIGHT;
            else if (c == INST_OPTION_START_TOPLEFT) start = M_START_TOPLEFT;
            else if (c == INST_OPTION_FILL_SPACE) chfill = ' ';
            else if (c == INST_OPTION_FILL_CHAR) chfill = o.get();
            else if (c == INST_OPTION_MOBILE_START) mobile = true;
            else if (c == INST_OPTION_ALL_PATHS) allpaths = true;
            else if (c == INST_QUANTIFIER_RANGE_OR_LINE_COMMENT && o.peek() == INST_QUANTIFIER_RANGE_OR_LINE_COMMENT) skip_comment(o);
            else if (is_dir_inst(c, false)) {
                o.back();
                dirs = read_dirs(o, false);
            } else if (!isspace(c)) {
                err << "Unrecognized option: " << c;
                return;
            }
        }
    }

    s_i body{ program, progEnc == ENC_UTF8, nl + 1 };
    P_Sequence *pat;
    try {
        pat = parse(body);
    } catch (parse_exc e) {
        err << "Parse error: " << e.what();
        if (~e.i) err << " at position " << e.i;
        err << std::endl;
        return;
    }
    bool empty;
    State global(Grid{ s_i{ input, progEnc != ENC_SINGLE_BYTE && detect_encoding(input) != ENC_SINGLE_BYTE },
        '\n', just, chfill, empty }, mobile);
    if (empty && type == M_TYPE_ALL) {
        out << 1;
        return;
    }

    int nmatch = 0;

    int xmax = start == M_START_ALLBOX ? global.cg.bWidth() : 1;
    int ymax = start == M_START_ALLBOX ? global.cg.bHeight() : 1;
    for (int y = 0; y < ymax; y++) {
        for (int x = 0; x < xmax; x++) {
            for (Direction &d : dirs) {
                State local{ global };
                local.direction = d.absdir();
                local.position = { x, y };
                int mr = match(local, pat, allpaths);
                if (mr > 0) {
                    if (type == M_TYPE_BOOLEAN) {
                        out << 1;
                        return;
                    }
                    nmatch += mr;
                } else if (mr == MATCH_RESULT_OVERFLOW) {
                    err << "Stack Overflow\n";
                    return;
                } else if (type == M_TYPE_ALL) {
                    out << 0;
                    return;
                }
            }
        }
    }
    if (type == M_TYPE_ALL) {
        out << 1;
    } else {
        out << nmatch;
    }
}